

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

void __thiscall
jsoncons::jmespath::detail::
token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
construct(token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *this,token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *other)

{
  token_kind tVar1;
  
  tVar1 = other->type_;
  this->type_ = tVar1;
  switch(tVar1) {
  case key:
  case variable_binding:
    std::__cxx11::string::operator=((string *)&this->key_,(string *)&other->key_);
    return;
  case literal:
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_move
              (&(this->field_2).value_,&(other->field_2).value_);
    return;
  case variable:
    std::__cxx11::string::operator=((string *)&this->key_,(string *)&other->key_);
  case expression:
  case binary_operator:
  case unary_operator:
  case function:
    (this->field_2).expression_ = (other->field_2).expression_;
  default:
    return;
  }
}

Assistant:

void construct(token<Json>&& other)
        {
            type_ = other.type_;
            switch (type_)
            {
                case token_kind::variable:
                    key_ = std::move(other.key_);
                    expression_ = other.expression_;
                    break;
                case token_kind::variable_binding:
                case token_kind::key:
                    key_ = std::move(other.key_);
                    break;
                case token_kind::literal:
                    new (&value_) Json(std::move(other.value_));
                    break;
                case token_kind::expression:
                    expression_ = other.expression_;
                    break;
                case token_kind::unary_operator:
                    unary_operator_ = other.unary_operator_;
                    break;
                case token_kind::binary_operator:
                    binary_operator_ = other.binary_operator_;
                    break;
                case token_kind::function:
                    function_ = other.function_;
                    break;
                default:
                    break;
            }
        }